

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 c_v64_unpackhi_s8_s16(c_v64 a)

{
  return (c_v64)((long)a.s8[4] & 0xffffU |
                (ulong)((int)((ulong)a >> 0x10) >> 8 & 0xffff0000) |
                (long)(a.u64 << 8) >> 0x18 & 0xffff00000000U | a.s64 >> 8 & 0xffff000000000000U);
}

Assistant:

SIMD_INLINE c_v64 c_v64_unpackhi_s8_s16(c_v64 a) {
  c_v64 t;
  int endian = !!CONFIG_BIG_ENDIAN * 4;
  t.s16[3] = (int16_t)a.s8[7 - endian];
  t.s16[2] = (int16_t)a.s8[6 - endian];
  t.s16[1] = (int16_t)a.s8[5 - endian];
  t.s16[0] = (int16_t)a.s8[4 - endian];
  return t;
}